

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

err_t bakeBSTSStart(void *state,bign_params *params,bake_settings *settings,octet *privkey,
                   bake_cert *cert)

{
  bool_t bVar1;
  int iVar2;
  void *dest;
  void *in_RCX;
  int *in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  bign_params *in_R8;
  void *stack;
  word *Q;
  size_t no;
  size_t n;
  bake_bsts_o *s;
  err_t code;
  void *in_stack_ffffffffffffff98;
  bign_params *in_stack_ffffffffffffffa0;
  void *stack_00;
  ec_o *ec;
  word *a;
  err_t local_4;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if (((((bVar1 == 0) || (bVar1 = memIsValid(in_RDX,0x38), bVar1 == 0)) || (*in_RDX != 1)) ||
      ((in_RDX[1] != 1 ||
       ((*(long *)(in_RDX + 2) != 0 &&
        (bVar1 = memIsValid(*(void **)(in_RDX + 2),*(size_t *)(in_RDX + 4)), bVar1 == 0)))))) ||
     ((*(long *)(in_RDX + 6) != 0 &&
      (bVar1 = memIsValid(*(void **)(in_RDX + 6),*(size_t *)(in_RDX + 8)), bVar1 == 0)))) {
    local_4 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(in_stack_ffffffffffffffa0);
    if (bVar1 == 0) {
      local_4 = 0x1f6;
    }
    else if (*(long *)(in_RDX + 10) == 0) {
      local_4 = 0x130;
    }
    else {
      bVar1 = memIsValid(in_RCX,*in_RSI >> 2);
      if (((bVar1 == 0) || (bVar1 = memIsValid(in_R8,0x18), bVar1 == 0)) ||
         ((bVar1 = memIsValid((void *)in_R8->l,*(size_t *)in_R8->p), bVar1 == 0 ||
          (*(long *)(in_R8->p + 8) == 0)))) {
        local_4 = 0x6d;
      }
      else {
        local_4 = bignStart(in_RCX,in_R8);
        if (local_4 == 0) {
          in_RDI[3] = (long)(in_RDI + 0x48);
          a = *(word **)(*(long *)(in_RDI[3] + 0x18) + 0x30);
          ec = *(ec_o **)(*(long *)(in_RDI[3] + 0x18) + 0x38);
          memCopy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x12ead0);
          memCopy(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x12eaeb);
          in_RDI[4] = in_RDI[3] + *(long *)in_RDI[3];
          in_RDI[5] = in_RDI[4] + (long)a * 8;
          in_RDI[6] = in_RDI[5];
          in_RDI[7] = in_RDI[5] + (long)a * 8;
          *in_RDI = *(long *)in_RDI[3] + 0x240 + (long)a * 0x20;
          in_RDI[1] = 5;
          in_RDI[2] = 1;
          u64From(&in_stack_ffffffffffffffa0->l,in_stack_ffffffffffffff98,0x12ebb4);
          dest = (void *)((long)in_RDI + *in_RDI);
          stack_00 = (void *)in_RDI[7];
          local_4 = (**(code **)(in_R8->p + 8))(stack_00,in_RSI,in_R8->l,*(undefined8 *)in_R8->p);
          if (local_4 == 0) {
            iVar2 = (**(code **)(*(long *)(in_RDI[3] + 0x18) + 0x40))
                              (stack_00,stack_00,*(undefined8 *)(in_RDI[3] + 0x18),dest);
            if (((iVar2 == 0) ||
                (iVar2 = (**(code **)(*(long *)(in_RDI[3] + 0x18) + 0x40))
                                   ((void *)((long)stack_00 + (long)a * 8),(long)stack_00 + (long)ec
                                    ,*(undefined8 *)(in_RDI[3] + 0x18),dest), iVar2 == 0)) ||
               (bVar1 = ecpIsOnA(a,ec,stack_00), bVar1 == 0)) {
              local_4 = 0x202;
            }
            else {
              memCopy(dest,in_stack_ffffffffffffff98,0x12eccd);
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t bakeBSTSStart(void* state, const bign_params* params,
	const bake_settings* settings, const octet privkey[],
	const bake_cert* cert)
{
	err_t code;
	bake_bsts_o* s = (bake_bsts_o*)state;
	size_t n, no;
	word* Q;
	// стек
	void* stack;
	// проверить входные данные
	if (!memIsValid(params, sizeof(bign_params)) ||
		!memIsValid(settings, sizeof(bake_settings)) ||
		settings->kca != TRUE || settings->kcb != TRUE ||
		!memIsNullOrValid(settings->helloa, settings->helloa_len) ||
		!memIsNullOrValid(settings->hellob, settings->hellob_len))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	if (settings->rng == 0)
		return ERR_BAD_RNG;
	if (!memIsValid(privkey, params->l / 4) ||
		!memIsValid(cert, sizeof(bake_cert)) ||
		!memIsValid(cert->data, cert->len) ||
		cert->val == 0)
		return ERR_BAD_INPUT;
	// загрузить параметры
	code = bignStart(s->data, params);
	ERR_CALL_CHECK(code);
	s->ec = (ec_o*)s->data;
	n = s->ec->f->n, no = s->ec->f->no;
	// сохранить параметры
	memCopy(s->params, params, sizeof(bign_params));
	// сохранить настройки
	memCopy(s->settings, settings, sizeof(bake_settings));
	// настроить указатели
	s->d = objEnd(s->ec, word);
	s->u = s->d + n;
	s->t = s->u;
	s->Vb = s->u + n;
	// настроить заголовок
	s->hdr.keep = sizeof(bake_bsts_o) + objKeep(s->ec) + O_OF_W(4 * n);
	s->hdr.p_count = 5;
	s->hdr.o_count = 1;
	// загрузить личный ключ
	wwFrom(s->d, privkey, no);
	// раскладка стека
	stack = objEnd(s, void);
	// проверить сертификат и его открытый ключ
	Q = s->Vb;
	code = cert->val((octet*)Q, params, cert->data, cert->len);
	ERR_CALL_CHECK(code);
	if (!qrFrom(ecX(Q), (octet*)Q, s->ec->f, stack) ||
		!qrFrom(ecY(Q, n), (octet*)Q + no, s->ec->f, stack) ||
		!ecpIsOnA(Q, s->ec, stack))
		return ERR_BAD_CERT;
	// сохранить сертификат
	memCopy(s->cert, cert, sizeof(bake_cert));
	// все нормально
	return code;
}